

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::TriangleInterpolationTest::iterate
          (TriangleInterpolationTest *this)

{
  pointer *this_00;
  pointer *this_01;
  bool bVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  size_type sVar5;
  reference pvVar6;
  PixelFormat *pPVar7;
  undefined1 local_4b8 [8];
  TriangleSceneSpec scene;
  RasterizationArguments args;
  int local_304;
  undefined1 local_300 [4];
  int vtxNdx;
  undefined1 local_180 [8];
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ScopedLogSection local_d8;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  TriangleInterpolationTest *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  resultImage.m_pixels.m_cap._4_4_ = this->m_iteration + 1;
  de::toString<int>(&local_118,(int *)((long)&resultImage.m_pixels.m_cap + 4));
  std::operator+(&local_f8,"Iteration",&local_118);
  tcu::ScopedLogSection::ScopedLogSection(&local_d8,pTVar3,&local_f8,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  iVar2 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,iVar2);
  this_00 = &colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00);
  this_01 = &triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_01);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)local_180);
  generateVertices(this,this->m_iteration,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00
                   ,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    this_01);
  extractTriangles(this,(vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         *)local_180,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &colorBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_300,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_300,(char (*) [20])"Generated vertices:");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_300);
  local_304 = 0;
  while( true ) {
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar5 <= local_304) break;
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&args.greenBits,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&args.greenBits,(char (*) [2])0x2b9722a);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &colorBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_304);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pvVar6);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [10])",\tcolor= ");
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &triangles.
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_304);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pvVar6);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&args.greenBits);
    local_304 = local_304 + 1;
  }
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,
             (Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             *(GLenum *)&(this->super_BaseRenderingCase).field_0xc4);
  tcu::TriangleSceneSpec::TriangleSceneSpec((TriangleSceneSpec *)local_4b8);
  scene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_BaseRenderingCase).m_numSamples;
  pPVar7 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
  args.numSamples = pPVar7->redBits;
  pPVar7 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
  args.subpixelBits = pPVar7->greenBits;
  pPVar7 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
  args.redBits = pPVar7->blueBits;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::swap((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *)local_4b8,
         (vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *)local_180);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  bVar1 = tcu::verifyTriangleGroupInterpolation
                    ((Surface *)
                     &drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (TriangleSceneSpec *)local_4b8,
                     (RasterizationArguments *)
                     ((long)&scene.triangles.
                             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pTVar3);
  if (!bVar1) {
    this->m_allIterationsPassed = false;
  }
  tcu::TriangleSceneSpec::~TriangleSceneSpec((TriangleSceneSpec *)local_4b8);
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  if (iVar2 == this->m_iterationCount) {
    if ((this->m_allIterationsPassed & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Found invalid pixel values");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = CONTINUE;
  }
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             *)local_180);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

TriangleInterpolationTest::IterateResult TriangleInterpolationTest::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_testCtx.getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");

		return STOP;
	}
	else
		return CONTINUE;
}